

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCE.h
# Opt level: O0

void __thiscall
BGIP_SolverCE::UpdateCEProbDistribution
          (BGIP_SolverCE *this,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *Xi,list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *best_samples)

{
  double dVar1;
  bool bVar2;
  type pBVar3;
  undefined8 uVar4;
  ulong uVar5;
  reference ppPVar6;
  ulong uVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar18 [16];
  double new_prob;
  Index acI_1;
  Index typeI_1;
  Index agI_2;
  Index acI;
  Index typeI;
  Index agI_1;
  vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *policies;
  shared_ptr<JointPolicyPureVector> p_jpol;
  size_t nrT;
  Index agI;
  const_iterator last;
  const_iterator it;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  counts;
  size_t nrSamples;
  size_t nrAgents;
  BayesianGameIdenticalPayoffSolver *in_stack_fffffffffffffdd8;
  list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *in_stack_fffffffffffffde0;
  allocator_type *in_stack_fffffffffffffde8;
  _List_node_base *in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffdf8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffe00;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_138;
  uint local_124;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_120;
  uint local_110;
  uint local_10c;
  _List_node_base *local_108;
  uint local_fc;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_f8;
  uint local_e8;
  uint local_e4;
  vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_> *local_e0;
  shared_ptr<JointPolicyPureVector> local_d8;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_c0 [5];
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_70;
  undefined8 local_60;
  uint local_54;
  _Self local_50;
  _Self local_48;
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_40;
  size_type local_28;
  size_type local_20;
  undefined1 auVar14 [64];
  undefined1 auVar17 [64];
  
  local_20 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::size(in_RSI);
  local_28 = std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::size
                       (in_stack_fffffffffffffde0);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
            *)0x132376);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::begin
                 ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                  in_stack_fffffffffffffdd8);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>::end
                 ((list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
                  in_stack_fffffffffffffdd8);
  for (local_54 = 0; local_54 < local_20; local_54 = local_54 + 1) {
    BayesianGameIdenticalPayoffSolver::GetBGIPI(in_stack_fffffffffffffdd8);
    pBVar3 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_70);
    uVar4 = (**(code **)(*(long *)pBVar3 + 0x28))(pBVar3,local_54,0,999999);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x13241b);
    local_60 = uVar4;
    BayesianGameIdenticalPayoffSolver::GetBGIPI(in_stack_fffffffffffffdd8);
    pBVar3 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(local_c0);
    (**(code **)(*(long *)pBVar3 + 0x20))(pBVar3,local_54);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x132497);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdf8,(allocator_type *)in_stack_fffffffffffffdf0);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x1324cb);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (value_type *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    std::
    vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
    ::push_back((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 *)in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)in_stack_fffffffffffffdf0);
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x132523);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffdf0);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x13253d);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x13254a);
  }
  while (bVar2 = std::operator!=(&local_48,&local_50), bVar2) {
    std::_List_const_iterator<JPPVValuePair_*>::operator*
              ((_List_const_iterator<JPPVValuePair_*> *)in_stack_fffffffffffffde0);
    JPPVValuePair::GetJPPV((JPPVValuePair *)in_stack_fffffffffffffdd8);
    boost::shared_ptr<JointPolicyPureVector>::operator->(&local_d8);
    local_e0 = JointPolicyPureVector::GetIndividualPolicies((JointPolicyPureVector *)0x13267c);
    for (local_e4 = 0; local_e4 < local_20; local_e4 = local_e4 + 1) {
      local_e8 = 0;
      while( true ) {
        uVar5 = (ulong)local_e8;
        BayesianGameIdenticalPayoffSolver::GetBGIPI(in_stack_fffffffffffffdd8);
        pBVar3 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                           (&local_f8);
        uVar7 = (**(code **)(*(long *)pBVar3 + 0x28))(pBVar3,local_e4,0,999999);
        boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                  ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x13272b);
        if (uVar7 <= uVar5) break;
        ppPVar6 = std::vector<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>::operator[]
                            (local_e0,(ulong)local_e4);
        local_fc = (**(code **)(*(long *)*ppPVar6 + 0x40))(*ppPVar6,local_e8);
        pvVar8 = std::
                 vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 ::operator[](&local_40,(ulong)local_e4);
        pvVar9 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](pvVar8,(ulong)local_e8);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar9,(ulong)local_fc);
        *pvVar10 = *pvVar10 + 1;
        local_e8 = local_e8 + 1;
      }
    }
    local_108 = (_List_node_base *)
                std::_List_const_iterator<JPPVValuePair_*>::operator++(&local_48,0);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x132848);
  }
  for (local_10c = 0; local_10c < local_20; local_10c = local_10c + 1) {
    local_110 = 0;
    while( true ) {
      uVar5 = (ulong)local_110;
      BayesianGameIdenticalPayoffSolver::GetBGIPI(in_stack_fffffffffffffdd8);
      pBVar3 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->(&local_120)
      ;
      uVar7 = (**(code **)(*(long *)pBVar3 + 0x28))(pBVar3,local_10c,0,999999);
      boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x1328e8);
      if (uVar7 <= uVar5) break;
      local_124 = 0;
      while( true ) {
        uVar5 = (ulong)local_124;
        BayesianGameIdenticalPayoffSolver::GetBGIPI(in_stack_fffffffffffffdd8);
        pBVar3 = boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::operator->
                           (&local_138);
        uVar7 = (**(code **)(*(long *)pBVar3 + 0x20))(pBVar3,local_10c);
        auVar17._8_56_ = extraout_var_00;
        auVar17._0_8_ = extraout_XMM1_Qa;
        auVar15 = auVar17._0_16_;
        auVar14._8_56_ = extraout_var;
        auVar14._0_8_ = extraout_XMM0_Qa;
        auVar12 = auVar14._0_16_;
        boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
                  ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x13295d);
        if (uVar7 <= uVar5) break;
        pvVar8 = std::
                 vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 ::operator[](&local_40,(ulong)local_10c);
        pvVar9 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](pvVar8,(ulong)local_110);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar9,(ulong)local_124);
        auVar12 = vcvtusi2sd_avx512f(auVar12,*pvVar10);
        auVar15 = vcvtusi2sd_avx512f(auVar15,local_28);
        dVar1 = *(double *)(in_RDI + 0x130);
        std::
        vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ::at((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
        pvVar11 = std::vector<double,_std::allocator<double>_>::at
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0,
                             (size_type)in_stack_fffffffffffffdd8);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = 1.0 - dVar1;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *pvVar11;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(double *)(in_RDI + 0x130) * (auVar12._0_8_ / auVar15._0_8_);
        auVar12 = vfmadd213sd_fma(auVar13,auVar16,auVar18);
        in_stack_fffffffffffffdf0 = auVar12._0_8_;
        std::
        vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ::at((vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffde0 =
             (list<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_> *)
             std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0,
                        (size_type)in_stack_fffffffffffffdd8);
        (in_stack_fffffffffffffde0->
        super__List_base<JPPVValuePair_*,_std::allocator<JPPVValuePair_*>_>)._M_impl._M_node.
        super__List_node_base._M_next = in_stack_fffffffffffffdf0;
        local_124 = local_124 + 1;
      }
      local_110 = local_110 + 1;
    }
  }
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

void UpdateCEProbDistribution(
        std::vector< std::vector< std::vector<double> > >& Xi, 
        const std::list<JPPVValuePair* >& best_samples)
        {
            size_t nrAgents = Xi.size();
            size_t nrSamples = best_samples.size();
            //get counts
            std::vector< std::vector< std::vector< unsigned int > > > counts;
            std::list<JPPVValuePair* >::const_iterator it = best_samples.begin();
            std::list<JPPVValuePair* >::const_iterator last = best_samples.end();
            for(Index agI=0; agI < nrAgents; agI++)    
            {
                size_t nrT =  this->GetBGIPI()->
                    GetNrPolicyDomainElements(agI, TYPE_INDEX);
                counts.push_back( 
                    std::vector< std::vector< unsigned int > >( 
                        nrT, 
                        std::vector<  unsigned int >(this->GetBGIPI()->GetNrActions(agI))
                        )
                    );
            }
            
            while(it != last)
            {
                boost::shared_ptr<JointPolicyPureVector> p_jpol= (*it)->GetJPPV();
                std::vector< PolicyPureVector* > & policies = 
                    p_jpol->GetIndividualPolicies();
                for(Index agI=0; agI < nrAgents; agI++)
                {
                    for(Index typeI=0; typeI < this->GetBGIPI()->
                            GetNrPolicyDomainElements(agI, TYPE_INDEX); typeI++)
                    {
                        Index acI = policies[agI]->GetActionIndex(typeI);
                        counts[agI][typeI][acI]++;
                    }
                }
                it++;
            }
            // update
    
            for(Index agI=0; agI < nrAgents; agI++)
                for(Index typeI=0; typeI < this->GetBGIPI()->
                        GetNrPolicyDomainElements(agI, TYPE_INDEX); typeI++)
                    for(Index acI=0; acI < this->GetBGIPI()->GetNrActions(agI); acI++)
                    {
                        double new_prob = ((double)counts[agI][typeI][acI])/nrSamples;
                        Xi.at(agI).at(typeI).at(acI) = 
                            (1 - _m_alpha)  * Xi.at(agI).at(typeI).at(acI) +
                            _m_alpha * new_prob;
                    }
        }